

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

bool __thiscall slang::parsing::Preprocessor::isDefined(Preprocessor *this,string_view name)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  uint64_t uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  ulong local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_68._M_str = name._M_str;
  local_68._M_len = name._M_len;
  if (local_68._M_len != 0) {
    uVar8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                      ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                       &this->macros,&local_68);
    uVar9 = uVar8 >> ((byte)(this->macros).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                            .arrays.groups_size_index & 0x3f);
    lVar10 = (uVar8 & 0xff) * 4;
    local_58 = (&UNK_0042856c)[lVar10];
    uStack_57 = (&UNK_0042856d)[lVar10];
    uStack_56 = (&UNK_0042856e)[lVar10];
    bStack_55 = (&UNK_0042856f)[lVar10];
    local_78 = 0;
    uStack_54 = local_58;
    uStack_53 = uStack_57;
    uStack_52 = uStack_56;
    bStack_51 = bStack_55;
    uStack_50 = local_58;
    uStack_4f = uStack_57;
    uStack_4e = uStack_56;
    bStack_4d = bStack_55;
    uStack_4c = local_58;
    uStack_4b = uStack_57;
    uStack_4a = uStack_56;
    bStack_49 = bStack_55;
    do {
      pgVar2 = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.groups_;
      pgVar1 = pgVar2 + uVar9;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bStack_39 = pgVar1->m[0xf].n;
      auVar11[0] = -(local_48 == local_58);
      auVar11[1] = -(uStack_47 == uStack_57);
      auVar11[2] = -(uStack_46 == uStack_56);
      auVar11[3] = -(bStack_45 == bStack_55);
      auVar11[4] = -(uStack_44 == uStack_54);
      auVar11[5] = -(uStack_43 == uStack_53);
      auVar11[6] = -(uStack_42 == uStack_52);
      auVar11[7] = -(bStack_41 == bStack_51);
      auVar11[8] = -(uStack_40 == uStack_50);
      auVar11[9] = -(uStack_3f == uStack_4f);
      auVar11[10] = -(uStack_3e == uStack_4e);
      auVar11[0xb] = -(bStack_3d == bStack_4d);
      auVar11[0xc] = -(uStack_3c == uStack_4c);
      auVar11[0xd] = -(uStack_3b == uStack_4b);
      auVar11[0xe] = -(uStack_3a == uStack_4a);
      auVar11[0xf] = -(bStack_39 == bStack_49);
      uVar7 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe);
      if (uVar7 != 0) {
        ppVar3 = (this->macros).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 .arrays.elements_;
        do {
          iVar5 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          bVar6 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             &this->macros,&local_68,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             ((long)&ppVar3[uVar9 * 0xf].first._M_len + (ulong)(uint)(iVar5 << 5)));
          if (bVar6) {
            return true;
          }
          uVar7 = uVar7 - 1 & uVar7;
        } while (uVar7 != 0);
        bStack_39 = pgVar2[uVar9].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar8 & 7] & bStack_39) == 0) {
        return false;
      }
      uVar4 = (this->macros).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
              .arrays.groups_size_mask;
      lVar10 = uVar9 + local_78;
      local_78 = local_78 + 1;
      uVar9 = lVar10 + 1U & uVar4;
    } while (local_78 <= uVar4);
  }
  return false;
}

Assistant:

bool Preprocessor::isDefined(std::string_view name) {
    return !name.empty() && macros.find(name) != macros.end();
}